

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxPortFactory.cpp
# Opt level: O2

string * __thiscall
LinuxPortFactory::next_abi_cxx11_(string *__return_storage_ptr__,LinuxPortFactory *this)

{
  string *psVar1;
  int iVar2;
  dirent *pdVar3;
  _func_int **pp_Var4;
  allocator<char> *__a;
  char *__s2;
  allocator<char> local_3b;
  allocator<char> local_3a;
  allocator<char> local_39;
  string *local_38;
  
  psVar1 = __return_storage_ptr__;
  if (this->_dir == (DIR *)0x0) {
    pp_Var4 = (this->super_PortFactoryBase)._vptr_PortFactoryBase;
LAB_0010e056:
    (*pp_Var4[3])(__return_storage_ptr__,this);
  }
  else {
    do {
      local_38 = psVar1;
      pdVar3 = readdir((DIR *)this->_dir);
      if (pdVar3 == (dirent *)0x0) {
        pp_Var4 = (this->super_PortFactoryBase)._vptr_PortFactoryBase;
        __return_storage_ptr__ = local_38;
        goto LAB_0010e056;
      }
      __s2 = pdVar3->d_name;
      iVar2 = strncmp("ttyUSB",__s2,6);
      if (iVar2 == 0) {
        __a = &local_39;
        goto LAB_0010e06d;
      }
      iVar2 = strncmp("ttyACM",__s2,6);
      if (iVar2 == 0) {
        __a = &local_3a;
        goto LAB_0010e06d;
      }
      iVar2 = strncmp("ttyS",__s2,4);
      psVar1 = local_38;
    } while (iVar2 != 0);
    __a = &local_3b;
LAB_0010e06d:
    __return_storage_ptr__ = local_38;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s2,__a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
LinuxPortFactory::next()
{
    struct dirent* entry;

    if (!_dir)
        return end();

    while ((entry = readdir(_dir)))
    {
        if (strncmp("ttyUSB", entry->d_name, sizeof("ttyUSB") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyACM", entry->d_name, sizeof("ttyACM") - 1) == 0)
            return std::string(entry->d_name);
        else if (strncmp("ttyS", entry->d_name, sizeof("ttyS") - 1) == 0)
            return std::string(entry->d_name);
    }

    return end();
}